

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O3

void aom_highbd_comp_mask_pred_sse2
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined2 *puVar1;
  undefined2 *puVar2;
  ulong uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  undefined1 auVar32 [11];
  undefined1 auVar33 [15];
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  bool bVar41;
  undefined1 (*pauVar42) [16];
  int iVar43;
  undefined1 (*pauVar44) [16];
  undefined1 (*pauVar45) [16];
  bool bVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  ushort uVar52;
  ushort uVar58;
  byte bVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 uVar73;
  short sVar72;
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  unkint10 Var53;
  undefined1 auVar63 [16];
  undefined1 auVar69 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar89 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar90 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar91 [16];
  undefined1 auVar96 [16];
  undefined1 auVar104 [16];
  undefined1 auVar99 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar107 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar112 [16];
  undefined1 auVar116 [16];
  
  pauVar44 = (undefined1 (*) [16])((long)comp_pred8 * 2);
  iVar47 = ref_stride;
  iVar48 = width;
  pauVar42 = (undefined1 (*) [16])((long)pred8 * 2);
  pauVar45 = (undefined1 (*) [16])((long)ref8 * 2);
  if (invert_mask == 0) {
    iVar47 = width;
    iVar48 = ref_stride;
    pauVar42 = (undefined1 (*) [16])((long)ref8 * 2);
    pauVar45 = (undefined1 (*) [16])((long)pred8 * 2);
  }
  lVar49 = (long)iVar48;
  if (width == 8) {
    iVar48 = 1;
    if (1 < height) {
      iVar48 = height;
    }
    do {
      auVar93 = *pauVar42;
      uVar3 = *(ulong *)mask;
      uVar73 = (undefined1)(uVar3 >> 0x38);
      auVar5._8_6_ = 0;
      auVar5._0_8_ = uVar3;
      auVar5[0xe] = uVar73;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar3;
      auVar8[0xc] = (char)(uVar3 >> 0x30);
      auVar8._13_2_ = auVar5._13_2_;
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar3;
      auVar11._12_3_ = auVar8._12_3_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar3;
      auVar14[10] = (char)(uVar3 >> 0x28);
      auVar14._11_4_ = auVar11._11_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar3;
      auVar17._10_5_ = auVar14._10_5_;
      auVar20[8] = (char)(uVar3 >> 0x20);
      auVar20._0_8_ = uVar3;
      auVar20._9_6_ = auVar17._9_6_;
      auVar31._7_8_ = 0;
      auVar31._0_7_ = auVar20._8_7_;
      Var29 = CONCAT81(SUB158(auVar31 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar37._9_6_ = 0;
      auVar37._0_9_ = Var29;
      auVar32._1_10_ = SUB1510(auVar37 << 0x30,5);
      auVar32[0] = (char)(uVar3 >> 0x10);
      auVar38._11_4_ = 0;
      auVar38._0_11_ = auVar32;
      uVar52 = (ushort)uVar3;
      auVar23[2] = (char)(uVar3 >> 8);
      auVar23._0_2_ = uVar52;
      auVar23._3_12_ = SUB1512(auVar38 << 0x20,3);
      auVar26._2_13_ = auVar23._2_13_;
      auVar26._0_2_ = uVar52 & 0xff;
      sVar72 = (short)Var29;
      auVar77._0_12_ = auVar93._0_12_;
      auVar77._12_2_ = auVar93._6_2_;
      auVar77._14_2_ = *(undefined2 *)(*pauVar45 + 6);
      auVar76._12_4_ = auVar77._12_4_;
      auVar76._0_10_ = auVar93._0_10_;
      auVar76._10_2_ = *(undefined2 *)(*pauVar45 + 4);
      auVar75._10_6_ = auVar76._10_6_;
      auVar75._0_8_ = auVar93._0_8_;
      auVar75._8_2_ = auVar93._4_2_;
      auVar65._8_8_ = auVar75._8_8_;
      auVar65._6_2_ = *(undefined2 *)(*pauVar45 + 2);
      auVar65._4_2_ = auVar93._2_2_;
      auVar65._0_2_ = auVar93._0_2_;
      auVar65._2_2_ = *(undefined2 *)*pauVar45;
      auVar85._0_12_ = auVar26._0_12_;
      auVar85._12_2_ = sVar72;
      auVar85._14_2_ = 0x40 - sVar72;
      auVar84._12_4_ = auVar85._12_4_;
      auVar84._0_10_ = auVar26._0_10_;
      auVar84._10_2_ = 0x40 - auVar32._0_2_;
      auVar83._10_6_ = auVar84._10_6_;
      auVar83._8_2_ = auVar32._0_2_;
      auVar83._6_2_ = 0x40 - auVar23._2_2_;
      auVar83._4_2_ = auVar23._2_2_;
      auVar83._0_4_ = CONCAT22(0x40 - (uVar52 & 0xff),uVar52) & 0xffff00ff;
      auVar86 = pmaddwd(auVar83,auVar65);
      auVar87._0_4_ = auVar86._0_4_ + 0x20 >> 6;
      auVar87._4_4_ = auVar86._4_4_ + 0x20 >> 6;
      auVar87._8_4_ = auVar86._8_4_ + 0x20 >> 6;
      auVar87._12_4_ = auVar86._12_4_ + 0x20 >> 6;
      auVar86._2_2_ = *(undefined2 *)(*pauVar45 + 8);
      auVar86._0_2_ = auVar93._8_2_;
      auVar86._4_2_ = auVar93._10_2_;
      auVar86._6_2_ = *(undefined2 *)(*pauVar45 + 10);
      auVar86._8_2_ = auVar93._12_2_;
      auVar86._10_2_ = *(undefined2 *)(*pauVar45 + 0xc);
      auVar86._12_2_ = auVar93._14_2_;
      auVar86._14_2_ = *(undefined2 *)(*pauVar45 + 0xe);
      auVar93._2_2_ = 0x40 - auVar20._8_2_;
      auVar93._0_2_ = auVar20._8_2_;
      auVar93._4_2_ = auVar14._10_2_;
      auVar93._6_2_ = 0x40 - auVar14._10_2_;
      auVar93._8_2_ = auVar8._12_2_;
      auVar93._10_2_ = 0x40 - auVar8._12_2_;
      auVar93[0xc] = uVar73;
      auVar93[0xd] = 0;
      auVar93._14_2_ = 0x40 - (auVar5._13_2_ >> 8);
      auVar93 = pmaddwd(auVar93,auVar86);
      auVar67._0_4_ = auVar93._0_4_ + 0x20 >> 6;
      auVar67._4_4_ = auVar93._4_4_ + 0x20 >> 6;
      auVar67._8_4_ = auVar93._8_4_ + 0x20 >> 6;
      auVar67._12_4_ = auVar93._12_4_ + 0x20 >> 6;
      auVar93 = packssdw(auVar87,auVar67);
      *pauVar44 = auVar93;
      mask = (uint8_t *)((long)mask + (long)mask_stride);
      pauVar44 = pauVar44 + 1;
      pauVar45 = (undefined1 (*) [16])(*pauVar45 + (long)iVar47 * 2);
      pauVar42 = (undefined1 (*) [16])(*pauVar42 + lVar49 * 2);
      iVar48 = iVar48 + -1;
    } while (iVar48 != 0);
  }
  else if (width == 0x10) {
    iVar48 = 1;
    if (1 < height) {
      iVar48 = height;
    }
    pauVar45 = pauVar45 + 1;
    pauVar42 = pauVar42 + 1;
    do {
      auVar93 = pauVar42[-1];
      auVar86 = *pauVar42;
      auVar67 = *(undefined1 (*) [16])mask;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar67._0_13_;
      auVar4[0xe] = auVar67[7];
      auVar7[0xc] = auVar67[6];
      auVar7._0_12_ = auVar67._0_12_;
      auVar7._13_2_ = auVar4._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar67._0_11_;
      auVar10._12_3_ = auVar7._12_3_;
      auVar13[10] = auVar67[5];
      auVar13._0_10_ = auVar67._0_10_;
      auVar13._11_4_ = auVar10._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = auVar67._0_9_;
      auVar16._10_5_ = auVar13._10_5_;
      auVar19[8] = auVar67[4];
      auVar19._0_8_ = auVar67._0_8_;
      auVar19._9_6_ = auVar16._9_6_;
      auVar28._7_8_ = 0;
      auVar28._0_7_ = auVar19._8_7_;
      Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),auVar67[3]);
      auVar35._9_6_ = 0;
      auVar35._0_9_ = Var29;
      auVar30._1_10_ = SUB1510(auVar35 << 0x30,5);
      auVar30[0] = auVar67[2];
      auVar36._11_4_ = 0;
      auVar36._0_11_ = auVar30;
      uVar58 = auVar67._0_2_;
      auVar22[2] = auVar67[1];
      auVar22._0_2_ = uVar58;
      auVar22._3_12_ = SUB1512(auVar36 << 0x20,3);
      auVar25._2_13_ = auVar22._2_13_;
      auVar25._0_2_ = uVar58 & 0xff;
      uVar52 = CONCAT11(0,auVar67[8]);
      Var53 = (unkuint10)auVar67[0xc] << 0x40;
      bVar59 = auVar67[0xd];
      auVar99[10] = bVar59;
      auVar99._0_10_ = Var53;
      auVar99[0xb] = 0;
      sVar72 = (short)Var29;
      auVar112._0_12_ = auVar93._0_12_;
      auVar112._12_2_ = auVar93._6_2_;
      auVar112._14_2_ = *(undefined2 *)(pauVar45[-1] + 6);
      auVar111._12_4_ = auVar112._12_4_;
      auVar111._0_10_ = auVar93._0_10_;
      auVar111._10_2_ = *(undefined2 *)(pauVar45[-1] + 4);
      auVar110._10_6_ = auVar111._10_6_;
      auVar110._0_8_ = auVar93._0_8_;
      auVar110._8_2_ = auVar93._4_2_;
      auVar109._8_8_ = auVar110._8_8_;
      auVar109._6_2_ = *(undefined2 *)(pauVar45[-1] + 2);
      auVar109._4_2_ = auVar93._2_2_;
      auVar109._0_2_ = auVar93._0_2_;
      auVar109._2_2_ = *(undefined2 *)pauVar45[-1];
      auVar64._0_12_ = auVar25._0_12_;
      auVar64._12_2_ = sVar72;
      auVar64._14_2_ = 0x40 - sVar72;
      auVar63._12_4_ = auVar64._12_4_;
      auVar63._0_10_ = auVar25._0_10_;
      auVar63._10_2_ = 0x40 - auVar30._0_2_;
      auVar62._10_6_ = auVar63._10_6_;
      auVar62._8_2_ = auVar30._0_2_;
      auVar62._6_2_ = 0x40 - auVar22._2_2_;
      auVar62._4_2_ = auVar22._2_2_;
      auVar62._0_4_ = CONCAT22(0x40 - (uVar58 & 0xff),uVar58) & 0xffff00ff;
      auVar65 = pmaddwd(auVar62,auVar109);
      auVar66._0_4_ = auVar65._0_4_ + 0x20 >> 6;
      auVar66._4_4_ = auVar65._4_4_ + 0x20 >> 6;
      auVar66._8_4_ = auVar65._8_4_ + 0x20 >> 6;
      auVar66._12_4_ = auVar65._12_4_ + 0x20 >> 6;
      auVar74._2_2_ = *(undefined2 *)(pauVar45[-1] + 8);
      auVar74._0_2_ = auVar93._8_2_;
      auVar74._4_2_ = auVar93._10_2_;
      auVar74._6_2_ = *(undefined2 *)(pauVar45[-1] + 10);
      auVar74._8_2_ = auVar93._12_2_;
      auVar74._10_2_ = *(undefined2 *)(pauVar45[-1] + 0xc);
      auVar74._12_2_ = auVar93._14_2_;
      auVar74._14_2_ = *(undefined2 *)(pauVar45[-1] + 0xe);
      auVar92._2_2_ = 0x40 - auVar19._8_2_;
      auVar92._0_2_ = auVar19._8_2_;
      auVar92._4_2_ = auVar13._10_2_;
      auVar92._6_2_ = 0x40 - auVar13._10_2_;
      auVar92._8_2_ = auVar7._12_2_;
      auVar92._10_2_ = 0x40 - auVar7._12_2_;
      auVar92[0xc] = auVar67[7];
      auVar92[0xd] = 0;
      auVar92._14_2_ = 0x40 - (auVar4._13_2_ >> 8);
      auVar93 = pmaddwd(auVar92,auVar74);
      auVar94._0_4_ = auVar93._0_4_ + 0x20 >> 6;
      auVar94._4_4_ = auVar93._4_4_ + 0x20 >> 6;
      auVar94._8_4_ = auVar93._8_4_ + 0x20 >> 6;
      auVar94._12_4_ = auVar93._12_4_ + 0x20 >> 6;
      auVar65 = packssdw(auVar66,auVar94);
      uVar58 = CONCAT11(0,auVar67[0xc]);
      auVar82._0_12_ = auVar86._0_12_;
      auVar82._12_2_ = auVar86._6_2_;
      auVar82._14_2_ = *(undefined2 *)(*pauVar45 + 6);
      auVar81._12_4_ = auVar82._12_4_;
      auVar81._0_10_ = auVar86._0_10_;
      auVar81._10_2_ = *(undefined2 *)(*pauVar45 + 4);
      auVar80._10_6_ = auVar81._10_6_;
      auVar80._0_8_ = auVar86._0_8_;
      auVar80._8_2_ = auVar86._4_2_;
      auVar79._8_8_ = auVar80._8_8_;
      auVar79._6_2_ = *(undefined2 *)(*pauVar45 + 2);
      auVar79._4_2_ = auVar86._2_2_;
      auVar79._0_2_ = auVar86._0_2_;
      auVar79._2_2_ = *(undefined2 *)*pauVar45;
      auVar99[0xc] = auVar67[0xb];
      auVar99[0xd] = 0;
      auVar99._14_2_ = 0x40 - (ushort)auVar67[0xb];
      auVar98._12_4_ = auVar99._12_4_;
      auVar98._10_2_ = 0x40 - (ushort)auVar67[10];
      auVar98._0_10_ = Var53;
      auVar97._10_6_ = auVar98._10_6_;
      auVar97._0_10_ = (unkuint10)auVar67[10] << 0x40;
      auVar96._8_8_ = auVar97._8_8_;
      auVar96._6_2_ = 0x40 - (ushort)auVar67[9];
      auVar96._0_6_ = (uint6)auVar67[9] << 0x20;
      auVar95._4_12_ = auVar96._4_12_;
      auVar95._2_2_ = 0x40 - uVar52;
      auVar95._0_2_ = uVar52;
      auVar93 = pmaddwd(auVar95,auVar79);
      auVar100._0_4_ = auVar93._0_4_ + 0x20 >> 6;
      auVar100._4_4_ = auVar93._4_4_ + 0x20 >> 6;
      auVar100._8_4_ = auVar93._8_4_ + 0x20 >> 6;
      auVar100._12_4_ = auVar93._12_4_ + 0x20 >> 6;
      auVar60._2_2_ = *(undefined2 *)(*pauVar45 + 8);
      auVar60._0_2_ = auVar86._8_2_;
      auVar60._4_2_ = auVar86._10_2_;
      auVar60._6_2_ = *(undefined2 *)(*pauVar45 + 10);
      auVar60._8_2_ = auVar86._12_2_;
      auVar60._10_2_ = *(undefined2 *)(*pauVar45 + 0xc);
      auVar60._12_2_ = auVar86._14_2_;
      auVar60._14_2_ = *(undefined2 *)(*pauVar45 + 0xe);
      auVar54._2_2_ = 0x40 - uVar58;
      auVar54._0_2_ = uVar58;
      auVar54[4] = bVar59;
      auVar54[5] = 0;
      auVar54._6_2_ = 0x40 - (ushort)bVar59;
      auVar54[8] = auVar67[0xe];
      auVar54[9] = 0;
      auVar54._10_2_ = 0x40 - (ushort)auVar67[0xe];
      auVar54[0xc] = auVar67[0xf];
      auVar54[0xd] = 0;
      auVar54._14_2_ = 0x40 - (ushort)auVar67[0xf];
      auVar93 = pmaddwd(auVar54,auVar60);
      auVar55._0_4_ = auVar93._0_4_ + 0x20 >> 6;
      auVar55._4_4_ = auVar93._4_4_ + 0x20 >> 6;
      auVar55._8_4_ = auVar93._8_4_ + 0x20 >> 6;
      auVar55._12_4_ = auVar93._12_4_ + 0x20 >> 6;
      auVar93 = packssdw(auVar100,auVar55);
      *pauVar44 = auVar65;
      pauVar44[1] = auVar93;
      mask = *(undefined1 (*) [16])mask + mask_stride;
      pauVar44 = pauVar44 + 2;
      pauVar45 = (undefined1 (*) [16])(*pauVar45 + (long)iVar47 * 2);
      pauVar42 = (undefined1 (*) [16])(*pauVar42 + lVar49 * 2);
      iVar48 = iVar48 + -1;
    } while (iVar48 != 0);
  }
  else {
    iVar48 = 1;
    if (1 < height) {
      iVar48 = height;
    }
    iVar43 = 0;
    do {
      if (0 < width) {
        lVar51 = 0;
        do {
          lVar50 = 0;
          bVar41 = true;
          do {
            bVar46 = bVar41;
            auVar93 = *(undefined1 (*) [16])(*pauVar42 + lVar50 * 2 + lVar51 * 2);
            auVar86 = *(undefined1 (*) [16])(pauVar42[1] + lVar50 * 2 + lVar51 * 2);
            puVar1 = (undefined2 *)(*pauVar45 + lVar50 * 2 + lVar51 * 2);
            puVar2 = (undefined2 *)(pauVar45[1] + lVar50 * 2 + lVar51 * 2);
            auVar67 = *(undefined1 (*) [16])(mask + lVar50 + lVar51);
            auVar6[0xd] = 0;
            auVar6._0_13_ = auVar67._0_13_;
            auVar6[0xe] = auVar67[7];
            auVar9[0xc] = auVar67[6];
            auVar9._0_12_ = auVar67._0_12_;
            auVar9._13_2_ = auVar6._13_2_;
            auVar12[0xb] = 0;
            auVar12._0_11_ = auVar67._0_11_;
            auVar12._12_3_ = auVar9._12_3_;
            auVar15[10] = auVar67[5];
            auVar15._0_10_ = auVar67._0_10_;
            auVar15._11_4_ = auVar12._11_4_;
            auVar18[9] = 0;
            auVar18._0_9_ = auVar67._0_9_;
            auVar18._10_5_ = auVar15._10_5_;
            auVar21[8] = auVar67[4];
            auVar21._0_8_ = auVar67._0_8_;
            auVar21._9_6_ = auVar18._9_6_;
            auVar33._7_8_ = 0;
            auVar33._0_7_ = auVar21._8_7_;
            Var29 = CONCAT81(SUB158(auVar33 << 0x40,7),auVar67[3]);
            auVar39._9_6_ = 0;
            auVar39._0_9_ = Var29;
            auVar34._1_10_ = SUB1510(auVar39 << 0x30,5);
            auVar34[0] = auVar67[2];
            auVar40._11_4_ = 0;
            auVar40._0_11_ = auVar34;
            uVar58 = auVar67._0_2_;
            auVar24[2] = auVar67[1];
            auVar24._0_2_ = uVar58;
            auVar24._3_12_ = SUB1512(auVar40 << 0x20,3);
            auVar27._2_13_ = auVar24._2_13_;
            auVar27._0_2_ = uVar58 & 0xff;
            uVar52 = CONCAT11(0,auVar67[8]);
            Var53 = (unkuint10)auVar67[0xc] << 0x40;
            bVar59 = auVar67[0xd];
            auVar107[10] = bVar59;
            auVar107._0_10_ = Var53;
            auVar107[0xb] = 0;
            sVar72 = (short)Var29;
            auVar116._0_12_ = auVar93._0_12_;
            auVar116._12_2_ = auVar93._6_2_;
            auVar116._14_2_ = puVar1[3];
            auVar115._12_4_ = auVar116._12_4_;
            auVar115._0_10_ = auVar93._0_10_;
            auVar115._10_2_ = puVar1[2];
            auVar114._10_6_ = auVar115._10_6_;
            auVar114._0_8_ = auVar93._0_8_;
            auVar114._8_2_ = auVar93._4_2_;
            auVar113._8_8_ = auVar114._8_8_;
            auVar113._6_2_ = puVar1[1];
            auVar113._4_2_ = auVar93._2_2_;
            auVar113._0_2_ = auVar93._0_2_;
            auVar113._2_2_ = *puVar1;
            auVar70._0_12_ = auVar27._0_12_;
            auVar70._12_2_ = sVar72;
            auVar70._14_2_ = 0x40 - sVar72;
            auVar69._12_4_ = auVar70._12_4_;
            auVar69._0_10_ = auVar27._0_10_;
            auVar69._10_2_ = 0x40 - auVar34._0_2_;
            auVar68._10_6_ = auVar69._10_6_;
            auVar68._8_2_ = auVar34._0_2_;
            auVar68._6_2_ = 0x40 - auVar24._2_2_;
            auVar68._4_2_ = auVar24._2_2_;
            auVar68._0_4_ = CONCAT22(0x40 - (uVar58 & 0xff),uVar58) & 0xffff00ff;
            auVar65 = pmaddwd(auVar68,auVar113);
            auVar71._0_4_ = auVar65._0_4_ + 0x20 >> 6;
            auVar71._4_4_ = auVar65._4_4_ + 0x20 >> 6;
            auVar71._8_4_ = auVar65._8_4_ + 0x20 >> 6;
            auVar71._12_4_ = auVar65._12_4_ + 0x20 >> 6;
            auVar78._2_2_ = puVar1[4];
            auVar78._0_2_ = auVar93._8_2_;
            auVar78._4_2_ = auVar93._10_2_;
            auVar78._6_2_ = puVar1[5];
            auVar78._8_2_ = auVar93._12_2_;
            auVar78._10_2_ = puVar1[6];
            auVar78._12_2_ = auVar93._14_2_;
            auVar78._14_2_ = puVar1[7];
            auVar101._2_2_ = 0x40 - auVar21._8_2_;
            auVar101._0_2_ = auVar21._8_2_;
            auVar101._4_2_ = auVar15._10_2_;
            auVar101._6_2_ = 0x40 - auVar15._10_2_;
            auVar101._8_2_ = auVar9._12_2_;
            auVar101._10_2_ = 0x40 - auVar9._12_2_;
            auVar101[0xc] = auVar67[7];
            auVar101[0xd] = 0;
            auVar101._14_2_ = 0x40 - (auVar6._13_2_ >> 8);
            auVar93 = pmaddwd(auVar101,auVar78);
            auVar102._0_4_ = auVar93._0_4_ + 0x20 >> 6;
            auVar102._4_4_ = auVar93._4_4_ + 0x20 >> 6;
            auVar102._8_4_ = auVar93._8_4_ + 0x20 >> 6;
            auVar102._12_4_ = auVar93._12_4_ + 0x20 >> 6;
            auVar65 = packssdw(auVar71,auVar102);
            uVar58 = CONCAT11(0,auVar67[0xc]);
            auVar91._0_12_ = auVar86._0_12_;
            auVar91._12_2_ = auVar86._6_2_;
            auVar91._14_2_ = puVar2[3];
            auVar90._12_4_ = auVar91._12_4_;
            auVar90._0_10_ = auVar86._0_10_;
            auVar90._10_2_ = puVar2[2];
            auVar89._10_6_ = auVar90._10_6_;
            auVar89._0_8_ = auVar86._0_8_;
            auVar89._8_2_ = auVar86._4_2_;
            auVar88._8_8_ = auVar89._8_8_;
            auVar88._6_2_ = puVar2[1];
            auVar88._4_2_ = auVar86._2_2_;
            auVar88._0_2_ = auVar86._0_2_;
            auVar88._2_2_ = *puVar2;
            auVar107[0xc] = auVar67[0xb];
            auVar107[0xd] = 0;
            auVar107._14_2_ = 0x40 - (ushort)auVar67[0xb];
            auVar106._12_4_ = auVar107._12_4_;
            auVar106._10_2_ = 0x40 - (ushort)auVar67[10];
            auVar106._0_10_ = Var53;
            auVar105._10_6_ = auVar106._10_6_;
            auVar105._0_10_ = (unkuint10)auVar67[10] << 0x40;
            auVar104._8_8_ = auVar105._8_8_;
            auVar104._6_2_ = 0x40 - (ushort)auVar67[9];
            auVar104._0_6_ = (uint6)auVar67[9] << 0x20;
            auVar103._4_12_ = auVar104._4_12_;
            auVar103._2_2_ = 0x40 - uVar52;
            auVar103._0_2_ = uVar52;
            auVar93 = pmaddwd(auVar103,auVar88);
            auVar108._0_4_ = auVar93._0_4_ + 0x20 >> 6;
            auVar108._4_4_ = auVar93._4_4_ + 0x20 >> 6;
            auVar108._8_4_ = auVar93._8_4_ + 0x20 >> 6;
            auVar108._12_4_ = auVar93._12_4_ + 0x20 >> 6;
            auVar61._2_2_ = puVar2[4];
            auVar61._0_2_ = auVar86._8_2_;
            auVar61._4_2_ = auVar86._10_2_;
            auVar61._6_2_ = puVar2[5];
            auVar61._8_2_ = auVar86._12_2_;
            auVar61._10_2_ = puVar2[6];
            auVar61._12_2_ = auVar86._14_2_;
            auVar61._14_2_ = puVar2[7];
            auVar56._2_2_ = 0x40 - uVar58;
            auVar56._0_2_ = uVar58;
            auVar56[4] = bVar59;
            auVar56[5] = 0;
            auVar56._6_2_ = 0x40 - (ushort)bVar59;
            auVar56[8] = auVar67[0xe];
            auVar56[9] = 0;
            auVar56._10_2_ = 0x40 - (ushort)auVar67[0xe];
            auVar56[0xc] = auVar67[0xf];
            auVar56[0xd] = 0;
            auVar56._14_2_ = 0x40 - (ushort)auVar67[0xf];
            auVar93 = pmaddwd(auVar56,auVar61);
            auVar57._0_4_ = auVar93._0_4_ + 0x20 >> 6;
            auVar57._4_4_ = auVar93._4_4_ + 0x20 >> 6;
            auVar57._8_4_ = auVar93._8_4_ + 0x20 >> 6;
            auVar57._12_4_ = auVar93._12_4_ + 0x20 >> 6;
            auVar93 = packssdw(auVar108,auVar57);
            *(undefined1 (*) [16])(*pauVar44 + lVar50 * 2) = auVar65;
            *(undefined1 (*) [16])(pauVar44[1] + lVar50 * 2) = auVar93;
            lVar50 = 0x10;
            bVar41 = false;
          } while (bVar46);
          pauVar44 = pauVar44 + 4;
          lVar51 = lVar51 + 0x20;
        } while (lVar51 < width);
      }
      pauVar42 = (undefined1 (*) [16])(*pauVar42 + lVar49 * 2);
      pauVar45 = (undefined1 (*) [16])(*pauVar45 + (long)iVar47 * 2);
      mask = mask + mask_stride;
      iVar43 = iVar43 + 1;
    } while (iVar43 != iVar48);
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_sse2(uint8_t *comp_pred8, const uint8_t *pred8,
                                    int width, int height, const uint8_t *ref8,
                                    int ref_stride, const uint8_t *mask,
                                    int mask_stride, int invert_mask) {
  int i = 0;
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  const uint16_t *src0 = invert_mask ? pred : ref;
  const uint16_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  const __m128i zero = _mm_setzero_si128();

  if (width == 8) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i m_8 = _mm_loadl_epi64((const __m128i *)mask);
      const __m128i m_16 = _mm_unpacklo_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else if (width == 16) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s2 = _mm_loadu_si128((const __m128i *)(src0 + 8));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i s3 = _mm_loadu_si128((const __m128i *)(src1 + 8));

      const __m128i m_8 = _mm_loadu_si128((const __m128i *)mask);
      const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
      const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
      const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);
      _mm_storeu_si128((__m128i *)(comp_pred + 8), comp1);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        for (int j = 0; j < 2; j++) {
          const __m128i s0 =
              _mm_loadu_si128((const __m128i *)(src0 + x + j * 16));
          const __m128i s2 =
              _mm_loadu_si128((const __m128i *)(src0 + x + 8 + j * 16));
          const __m128i s1 =
              _mm_loadu_si128((const __m128i *)(src1 + x + j * 16));
          const __m128i s3 =
              _mm_loadu_si128((const __m128i *)(src1 + x + 8 + j * 16));

          const __m128i m_8 =
              _mm_loadu_si128((const __m128i *)(mask + x + j * 16));
          const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
          const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

          const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
          const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

          _mm_storeu_si128((__m128i *)(comp_pred + j * 16), comp);
          _mm_storeu_si128((__m128i *)(comp_pred + 8 + j * 16), comp1);
        }
        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i += 1;
    } while (i < height);
  }
}